

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_attention.h
# Opt level: O3

void __thiscall
shift_window_transformer::WindowAttention<float>::WindowAttention
          (WindowAttention<float> *this,int dim,int heads,int headDim,bool shifted,int windowSize,
          bool relativePosEmbedding)

{
  int *piVar1;
  iterator iVar2;
  double dVar3;
  result_type rVar4;
  uint uVar5;
  Linear<float> *pLVar6;
  CyclicShift<float> *pCVar7;
  Tensor<float> *pTVar8;
  ulong uVar9;
  Tensor<int> *pTVar10;
  int *piVar11;
  long lVar12;
  iterator iVar13;
  int iVar14;
  float fVar15;
  mt19937 gen;
  random_device rd;
  float local_2774;
  ulong local_2770;
  normal_distribution<double> local_2768;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  *(undefined ***)this = &PTR_forward_0010bae8;
  this->cyclicShift = (CyclicShift<float> *)0x0;
  this->cyclicBackShift = (CyclicShift<float> *)0x0;
  this->qLinear = (Linear<float> *)0x0;
  this->kLinear = (Linear<float> *)0x0;
  this->vLinear = (Linear<float> *)0x0;
  this->outLinear = (Linear<float> *)0x0;
  this->upperLowerMask = (Tensor<float> *)0x0;
  this->leftRightMask = (Tensor<float> *)0x0;
  this->relativeIndices = (Tensor<int> *)0x0;
  this->posEmbedding = (Tensor<float> *)0x0;
  this->softMax = (SoftMax<float>)&PTR_forward_0010bc00;
  this->windowSize = windowSize;
  this->shifted = shifted;
  iVar14 = headDim * heads;
  this->innerDim = iVar14;
  this->headDim = headDim;
  dVar3 = (double)headDim;
  this->heads = heads;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  this->scale = (float)(1.0 / dVar3);
  this->relativePosEmbedding = relativePosEmbedding;
  pLVar6 = (Linear<float> *)operator_new(0x28);
  Linear<float>::Linear(pLVar6,dim,iVar14,false);
  this->qLinear = pLVar6;
  pLVar6 = (Linear<float> *)operator_new(0x28);
  Linear<float>::Linear(pLVar6,dim,iVar14,false);
  this->kLinear = pLVar6;
  pLVar6 = (Linear<float> *)operator_new(0x28);
  Linear<float>::Linear(pLVar6,dim,iVar14,false);
  this->vLinear = pLVar6;
  pLVar6 = (Linear<float> *)operator_new(0x28);
  Linear<float>::Linear(pLVar6,iVar14,dim,true);
  this->outLinear = pLVar6;
  if (shifted) {
    iVar14 = windowSize / 2;
    pCVar7 = (CyclicShift<float> *)operator_new(0x10);
    *(undefined ***)pCVar7 = &PTR_forward_0010bc60;
    pCVar7->displacement = -iVar14;
    this->cyclicShift = pCVar7;
    pCVar7 = (CyclicShift<float> *)operator_new(0x10);
    *(undefined ***)pCVar7 = &PTR_forward_0010bc60;
    pCVar7->displacement = iVar14;
    this->cyclicBackShift = pCVar7;
    pTVar8 = create_mask<float>(windowSize,iVar14,true,false);
    this->upperLowerMask = pTVar8;
    pTVar8 = create_mask<float>(windowSize,iVar14,false,true);
    this->leftRightMask = pTVar8;
  }
  std::random_device::random_device(&local_13b8);
  uVar5 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar5;
  lVar12 = 1;
  uVar9 = local_2740._M_x[0];
  do {
    uVar9 = (ulong)(((uint)(uVar9 >> 0x1e) ^ (uint)uVar9) * 0x6c078965 + (int)lVar12);
    local_2740._M_x[lVar12] = uVar9;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x270);
  local_2740._M_p = 0x270;
  local_2768._M_param._M_mean._0_4_ = 0;
  local_2768._M_param._M_mean._4_4_ = 0;
  local_2768._M_param._M_stddev._0_4_ = 0;
  local_2768._M_param._M_stddev._4_4_ = 0x3ff00000;
  local_2768._M_saved = 0.0;
  local_2768._M_saved_available = false;
  if (relativePosEmbedding) {
    pTVar10 = get_relative_distances<int>(windowSize);
    this->relativeIndices = pTVar10;
    piVar11 = (pTVar10->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    piVar1 = (pTVar10->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ;
    if (piVar11 != piVar1) {
      do {
        *piVar11 = *piVar11 + windowSize + -1;
        piVar11 = piVar11 + 1;
      } while (piVar11 != piVar1);
    }
    pTVar8 = (Tensor<float> *)operator_new(0x30);
    (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (pTVar8->super_vector<float,_std::allocator<float>_>).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (pTVar8->super_vector<float,_std::allocator<float>_>).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (pTVar8->super_vector<float,_std::allocator<float>_>).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    this->posEmbedding = pTVar8;
    iVar14 = windowSize * 2 + -1;
    local_2770 = CONCAT44(local_2770._4_4_,iVar14);
    iVar14 = iVar14 * iVar14 + 1;
    do {
      pTVar8 = this->posEmbedding;
      rVar4 = std::normal_distribution<double>::operator()
                        (&local_2768,&local_2740,&local_2768._M_param);
      local_2774 = (float)rVar4;
      iVar2._M_current =
           (pTVar8->super_vector<float,_std::allocator<float>_>).
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar2._M_current ==
          (pTVar8->super_vector<float,_std::allocator<float>_>).
          super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&pTVar8->super_vector<float,_std::allocator<float>_>,iVar2,&local_2774);
      }
      else {
        *iVar2._M_current = local_2774;
        (pTVar8->super_vector<float,_std::allocator<float>_>).
        super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
             = iVar2._M_current + 1;
      }
      iVar14 = iVar14 + -1;
    } while (1 < iVar14);
    pTVar8 = this->posEmbedding;
    fVar15 = (float)local_2770;
    local_2774 = (float)local_2770;
    iVar13._M_current =
         (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar11 = (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    if (iVar13._M_current == piVar11) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&pTVar8->shape,iVar13,(int *)&local_2774);
      pTVar8 = this->posEmbedding;
      iVar13._M_current =
           (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      piVar11 = (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar13._M_current = (int)(float)local_2770;
      iVar13._M_current = iVar13._M_current + 1;
      (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iVar13._M_current;
    }
    local_2774 = fVar15;
    if (iVar13._M_current == piVar11) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&pTVar8->shape,iVar13,(int *)&local_2774);
    }
    else {
      *iVar13._M_current = (int)fVar15;
      (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iVar13._M_current + 1;
    }
  }
  else {
    pTVar8 = (Tensor<float> *)operator_new(0x30);
    (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (pTVar8->super_vector<float,_std::allocator<float>_>).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (pTVar8->super_vector<float,_std::allocator<float>_>).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (pTVar8->super_vector<float,_std::allocator<float>_>).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    this->posEmbedding = pTVar8;
    uVar5 = windowSize * windowSize;
    local_2770 = (ulong)uVar5;
    if (0 < (int)(uVar5 * uVar5)) {
      uVar5 = uVar5 * uVar5 + 1;
      do {
        pTVar8 = this->posEmbedding;
        rVar4 = std::normal_distribution<double>::operator()
                          (&local_2768,&local_2740,&local_2768._M_param);
        local_2774 = (float)rVar4;
        iVar2._M_current =
             (pTVar8->super_vector<float,_std::allocator<float>_>).
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar2._M_current ==
            (pTVar8->super_vector<float,_std::allocator<float>_>).
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                    (&pTVar8->super_vector<float,_std::allocator<float>_>,iVar2,&local_2774);
        }
        else {
          *iVar2._M_current = local_2774;
          (pTVar8->super_vector<float,_std::allocator<float>_>).
          super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish = iVar2._M_current + 1;
        }
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
      pTVar8 = this->posEmbedding;
    }
    fVar15 = (float)local_2770;
    iVar13._M_current =
         (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar11 = (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    if (iVar13._M_current == piVar11) {
      local_2774 = fVar15;
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&pTVar8->shape,iVar13,(int *)&local_2774);
      pTVar8 = this->posEmbedding;
      iVar13._M_current =
           (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      piVar11 = (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar13._M_current = (int)fVar15;
      iVar13._M_current = iVar13._M_current + 1;
      (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iVar13._M_current;
    }
    if (iVar13._M_current == piVar11) {
      local_2774 = fVar15;
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&pTVar8->shape,iVar13,(int *)&local_2774);
    }
    else {
      *iVar13._M_current = (int)fVar15;
      (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iVar13._M_current + 1;
      local_2774 = fVar15;
    }
  }
  std::random_device::_M_fini();
  return;
}

Assistant:

WindowAttention(int dim, int heads, int headDim, bool shifted, int windowSize, bool relativePosEmbedding)
                : shifted(shifted),
                  scale(1 / sqrt(headDim)),
                  innerDim(heads * headDim),
                  heads(heads),
                  headDim(headDim),
                  windowSize(windowSize),
                  relativePosEmbedding(relativePosEmbedding) {
            qLinear = new Linear<T>(dim, heads * headDim, false);
            kLinear = new Linear<T>(dim, heads * headDim, false);
            vLinear = new Linear<T>(dim, heads * headDim, false);
            outLinear = new Linear<T>(heads * headDim, dim);
            if (shifted) {
                int displacement = windowSize / 2;
                cyclicShift = new CyclicShift<T>(-displacement);
                cyclicBackShift = new CyclicShift<T>(displacement);
                upperLowerMask = create_mask<T>(windowSize, displacement, true, false);
                leftRightMask = create_mask<T>(windowSize, displacement, false, true);
            }
            std::random_device rd{};
            std::mt19937 gen{rd()};
            std::normal_distribution<> d{0, 1};
            if (relativePosEmbedding) {
                relativeIndices = get_relative_distances<int>(windowSize);
                for (auto &item: *relativeIndices) {
                    item = item + windowSize - 1;
                }
                posEmbedding = new Tensor<T>();
                int cnt = (2 * windowSize - 1) * (2 * windowSize - 1);
                while (cnt-- > 0) {
                    posEmbedding->push_back((T) d(gen));
                }
                posEmbedding->shape.push_back(2 * windowSize - 1);
                posEmbedding->shape.push_back(2 * windowSize - 1);
            } else {
                posEmbedding = new Tensor<T>();
                int cnt = windowSize * windowSize * windowSize * windowSize;
                while (cnt-- > 0) {
                    posEmbedding->push_back((T) d(gen));
                }
                posEmbedding->shape.push_back(windowSize * windowSize);
                posEmbedding->shape.push_back(windowSize * windowSize);
            }
        }